

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageNextXrDestroyPlaneDetectorEXT(XrPlaneDetectorEXT planeDetector)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_planedetectorext_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  XrResult result;
  XrPlaneDetectorEXT planeDetector_local;
  
  pVar2 = HandleInfo<XrPlaneDetectorEXT_T_*>::getWithInstanceInfo
                    (&g_planedetectorext_info,planeDetector);
  XVar1 = (*(pVar2.second)->dispatch_table->DestroyPlaneDetectorEXT)(planeDetector);
  if (XR_ERROR_VALIDATION_FAILURE < XVar1) {
    HandleInfoBase<XrPlaneDetectorEXT_T_*,_GenValidUsageXrHandleInfo>::erase
              (&g_planedetectorext_info.
                super_HandleInfoBase<XrPlaneDetectorEXT_T_*,_GenValidUsageXrHandleInfo>,
               planeDetector);
  }
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrDestroyPlaneDetectorEXT(
    XrPlaneDetectorEXT planeDetector) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_planedetectorext_info.getWithInstanceInfo(planeDetector);
        GenValidUsageXrHandleInfo *gen_planedetectorext_info = info_with_instance.first;
        (void)gen_planedetectorext_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->DestroyPlaneDetectorEXT(planeDetector);
        if (XR_SUCCEEDED(result)) {
            g_planedetectorext_info.erase(planeDetector);
        }
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}